

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1-client.c
# Opt level: O0

size_t ssh1mainchan_write(SshChannel *sc,_Bool is_stderr,void *data,size_t len)

{
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_connection_state *s;
  size_t len_local;
  void *data_local;
  _Bool is_stderr_local;
  SshChannel *sc_local;
  
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)sc[0xd].cl,0x10);
  BinarySink_put_string(pPVar1->binarysink_,data,len);
  pq_base_push((PacketQueueBase *)sc[0xe].cl,&pPVar1->qnode);
  return 0;
}

Assistant:

static size_t ssh1mainchan_write(
    SshChannel *sc, bool is_stderr, const void *data, size_t len)
{
    struct ssh1_connection_state *s =
        container_of(sc, struct ssh1_connection_state, mainchan_sc);
    PktOut *pktout;

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_CMSG_STDIN_DATA);
    put_string(pktout, data, len);
    pq_push(s->ppl.out_pq, pktout);

    return 0;
}